

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O1

void __thiscall QListModel::clear(QListModel *this)

{
  QListWidgetItem **ppQVar1;
  QListWidgetItem *pQVar2;
  ulong uVar3;
  
  QAbstractItemModel::beginResetModel();
  if ((this->items).d.size != 0) {
    uVar3 = 0;
    do {
      ppQVar1 = (this->items).d.ptr;
      pQVar2 = ppQVar1[uVar3];
      if (pQVar2 != (QListWidgetItem *)0x0) {
        pQVar2->d->theid = -1;
        pQVar2->view = (QListWidget *)0x0;
        pQVar2 = ppQVar1[uVar3];
        if (pQVar2 != (QListWidgetItem *)0x0) {
          (*pQVar2->_vptr_QListWidgetItem[1])();
        }
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)(this->items).d.size);
  }
  QList<QListWidgetItem_*>::clear(&this->items);
  QAbstractItemModel::endResetModel();
  return;
}

Assistant:

void QListModel::clear()
{
    beginResetModel();
    for (int i = 0; i < items.size(); ++i) {
        if (items.at(i)) {
            items.at(i)->d->theid = -1;
            items.at(i)->view = nullptr;
            delete items.at(i);
        }
    }
    items.clear();
    endResetModel();
}